

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmGraphicsShaderTestUtil.hpp
# Opt level: O3

InstanceContext * __thiscall
vkt::SpirVAssembly::createInstanceContext<3ul>
          (InstanceContext *__return_storage_ptr__,SpirVAssembly *this,ShaderElement (*elements) [3]
          ,RGBA (*inputColors) [4],RGBA (*outputColors) [4],
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *testCodeFragments,StageToSpecConstantMap *specConstants,qpTestResult failResult,
          string *failMessageTemplate)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  vector<std::pair<std::__cxx11::string,vk::VkShaderStageFlagBits>,std::allocator<std::pair<std::__cxx11::string,vk::VkShaderStageFlagBits>>>
  *this_00;
  long lVar2;
  undefined4 in_stack_00000014;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>
  local_58;
  
  InstanceContext::InstanceContext
            (__return_storage_ptr__,(RGBA (*) [4])elements,inputColors,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)outputColors,(StageToSpecConstantMap *)testCodeFragments);
  paVar1 = &local_58.first.field_2;
  lVar2 = 0;
  do {
    this_00 = (vector<std::pair<std::__cxx11::string,vk::VkShaderStageFlagBits>,std::allocator<std::pair<std::__cxx11::string,vk::VkShaderStageFlagBits>>>
               *)std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>_>_>_>_>_>
                 ::operator[](&__return_storage_ptr__->moduleMap,(key_type *)(this + lVar2));
    local_58.first._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_58,*(long *)(this + lVar2 + 0x20),
               *(long *)(this + lVar2 + 0x28) + *(long *)(this + lVar2 + 0x20));
    local_58.second = *(VkShaderStageFlagBits *)(this + lVar2 + 0x40);
    std::
    vector<std::pair<std::__cxx11::string,vk::VkShaderStageFlagBits>,std::allocator<std::pair<std::__cxx11::string,vk::VkShaderStageFlagBits>>>
    ::emplace_back<std::pair<std::__cxx11::string,vk::VkShaderStageFlagBits>>(this_00,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58.first._M_dataplus._M_p != paVar1) {
      operator_delete(local_58.first._M_dataplus._M_p,
                      local_58.first.field_2._M_allocated_capacity + 1);
    }
    __return_storage_ptr__->requiredStages =
         __return_storage_ptr__->requiredStages | *(VkShaderStageFlagBits *)(this + lVar2 + 0x40);
    lVar2 = lVar2 + 0x48;
  } while (lVar2 != 0xd8);
  __return_storage_ptr__->failResult = (qpTestResult)specConstants;
  if (*(long *)(CONCAT44(in_stack_00000014,failResult) + 8) != 0) {
    std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->failMessageTemplate);
  }
  return __return_storage_ptr__;
}

Assistant:

InstanceContext createInstanceContext (const ShaderElement							(&elements)[N],
									   const tcu::RGBA								(&inputColors)[4],
									   const tcu::RGBA								(&outputColors)[4],
									   const std::map<std::string, std::string>&	testCodeFragments,
									   const StageToSpecConstantMap&				specConstants,
									   const qpTestResult							failResult			= QP_TEST_RESULT_FAIL,
									   const std::string&							failMessageTemplate	= std::string())
{
	InstanceContext ctx (inputColors, outputColors, testCodeFragments, specConstants);
	for (size_t i = 0; i < N; ++i)
	{
		ctx.moduleMap[elements[i].moduleName].push_back(std::make_pair(elements[i].entryName, elements[i].stage));
		ctx.requiredStages = static_cast<vk::VkShaderStageFlagBits>(ctx.requiredStages | elements[i].stage);
	}
	ctx.failResult				= failResult;
	if (!failMessageTemplate.empty())
		ctx.failMessageTemplate	= failMessageTemplate;
	return ctx;
}